

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV2NodeTransformBlock(Parser *this,BaseNode *mesh)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  size_t __n;
  bool bVar4;
  uint i;
  int iVar5;
  int iVar6;
  Logger *pLVar7;
  uint uVar8;
  int iVar9;
  aiMatrix4x4 *apOut;
  int iVar10;
  char *pcVar11;
  long lVar12;
  string temp;
  string local_a8;
  aiMatrix4x4 *local_88;
  aiMatrix4x4 *local_80;
  aiMatrix4x4 *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_78 = &mesh->mTransform;
  local_80 = (aiMatrix4x4 *)&(mesh->mTransform).b1;
  local_88 = (aiMatrix4x4 *)&(mesh->mTransform).c1;
  iVar9 = 0;
  iVar10 = 0;
LAB_00411be3:
  do {
    while (pcVar2 = this->filePtr, *pcVar2 != '*') {
LAB_00411cfa:
      pbVar3 = (byte *)this->filePtr;
      bVar1 = *pbVar3;
      uVar8 = (uint)bVar1;
      if (bVar1 == 0x7b) {
        iVar10 = iVar10 + 1;
      }
      else if (bVar1 == 0x7d) {
        iVar10 = iVar10 + -1;
        if (iVar10 == 0) {
          this->filePtr = (char *)(pbVar3 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (uVar8 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *NODE_TM chunk (Level 2)");
      }
      if (((uVar8 < 0xe) && ((0x3401U >> (uVar8 & 0x1f) & 1) != 0)) &&
         (this->bLastWasEndLine == false)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = (char *)(pbVar3 + 1);
    }
    this->filePtr = pcVar2 + 1;
    iVar5 = strncmp("NODE_NAME",pcVar2 + 1,9);
    if (iVar5 == 0) {
      bVar1 = pcVar2[10];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pcVar11 = pcVar2 + 0xb;
        if (bVar1 == 0) {
          pcVar11 = pcVar2 + 10;
        }
        this->filePtr = pcVar11;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        local_a8._M_string_length = 0;
        local_a8.field_2._M_local_buf[0] = '\0';
        bVar4 = ParseString(this,&local_a8,"*NODE_NAME");
        if (!bVar4) {
          SkipToNextToken(this);
        }
        if ((local_a8._M_string_length != (mesh->mName)._M_string_length) ||
           ((iVar5 = 1, local_a8._M_string_length != 0 &&
            (iVar6 = bcmp(local_a8._M_dataplus._M_p,(mesh->mName)._M_dataplus._M_p,
                          local_a8._M_string_length), iVar6 != 0)))) {
          bVar4 = false;
          lVar12 = std::__cxx11::string::find((char *)&local_a8,0x6dbddd,0);
          if (lVar12 != -1) {
            std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_a8);
            __n = (mesh->mName)._M_string_length;
            if (__n == local_48) {
              if (__n == 0) {
                bVar4 = true;
              }
              else {
                iVar5 = bcmp((mesh->mName)._M_dataplus._M_p,local_50,__n);
                bVar4 = iVar5 == 0;
              }
            }
            else {
              bVar4 = false;
            }
          }
          if ((lVar12 != -1) && (local_50 != local_40)) {
            operator_delete(local_50,local_40[0] + 1);
          }
          iVar5 = iVar9;
          if (bVar4) {
            if (mesh->mType == Camera) {
              iVar6 = *(int *)&mesh[1].mName._M_dataplus._M_p;
joined_r0x00411fa3:
              iVar5 = 2;
              if (iVar6 == 1) goto LAB_00412008;
            }
            else if (mesh->mType == Light) {
              iVar6 = *(int *)&mesh->field_0x154;
              goto joined_r0x00411fa3;
            }
            pLVar7 = DefaultLogger::get();
            Logger::error(pLVar7,
                          "ASE: Ignoring target transform, this is no spot light or target camera");
            iVar5 = iVar9;
          }
          else {
            pLVar7 = DefaultLogger::get();
            std::operator+(&local_70,"ASE: Unknown node transformation: ",&local_a8);
            Logger::error(pLVar7,local_70._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
        }
LAB_00412008:
        iVar9 = iVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_00411be3;
      }
    }
    if (iVar9 == 0) goto LAB_00411cfa;
    pcVar2 = this->filePtr;
    iVar5 = strncmp("TM_ROW3",pcVar2,7);
    if (iVar5 == 0) {
      bVar1 = pcVar2[7];
      if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
      goto LAB_00411c37;
      pcVar11 = pcVar2 + 8;
      if (bVar1 == 0) {
        pcVar11 = pcVar2 + 7;
      }
      this->filePtr = pcVar11;
      ParseLV4MeshFloatTriple
                (this,(ai_real *)((long)&mesh->inherit + (ulong)(iVar9 != 1) * 0x10 + -0x1c));
    }
    else {
LAB_00411c37:
      if (iVar9 != 1) goto LAB_00411cfa;
      pcVar2 = this->filePtr;
      iVar5 = strncmp("TM_ROW0",pcVar2,7);
      if (iVar5 != 0) {
LAB_00411c5f:
        pcVar2 = this->filePtr;
        iVar5 = strncmp("TM_ROW1",pcVar2,7);
        if (iVar5 == 0) {
          bVar1 = pcVar2[7];
          if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
            pcVar11 = pcVar2 + 8;
            if (bVar1 == 0) {
              pcVar11 = pcVar2 + 7;
            }
            this->filePtr = pcVar11;
            apOut = local_80;
            goto LAB_0041206e;
          }
        }
        pcVar2 = this->filePtr;
        iVar5 = strncmp("TM_ROW2",pcVar2,7);
        if (iVar5 == 0) {
          bVar1 = pcVar2[7];
          if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
            pcVar11 = pcVar2 + 8;
            if (bVar1 == 0) {
              pcVar11 = pcVar2 + 7;
            }
            this->filePtr = pcVar11;
            apOut = local_88;
            goto LAB_0041206e;
          }
        }
        pcVar2 = this->filePtr;
        iVar5 = strncmp("INHERIT_POS",pcVar2,0xb);
        if (iVar5 == 0) {
          bVar1 = pcVar2[0xb];
          if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
            pcVar11 = pcVar2 + 0xc;
            if (bVar1 == 0) {
              pcVar11 = pcVar2 + 0xb;
            }
            this->filePtr = pcVar11;
            lVar12 = 0;
            do {
              ParseLV4MeshLong(this,(uint *)((long)&local_a8._M_dataplus._M_p + lVar12));
              lVar12 = lVar12 + 4;
            } while (lVar12 != 0xc);
            lVar12 = 0;
            do {
              (mesh->inherit).abInheritPosition[lVar12] =
                   *(int *)((long)&local_a8._M_dataplus._M_p + lVar12 * 4) != 0;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            goto LAB_00412073;
          }
        }
        pcVar2 = this->filePtr;
        iVar5 = strncmp("INHERIT_ROT",pcVar2,0xb);
        if (iVar5 == 0) {
          bVar1 = pcVar2[0xb];
          if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
            pcVar11 = pcVar2 + 0xc;
            if (bVar1 == 0) {
              pcVar11 = pcVar2 + 0xb;
            }
            this->filePtr = pcVar11;
            lVar12 = 0;
            do {
              ParseLV4MeshLong(this,(uint *)((long)&local_a8._M_dataplus._M_p + lVar12));
              lVar12 = lVar12 + 4;
            } while (lVar12 != 0xc);
            lVar12 = 0;
            do {
              (mesh->inherit).abInheritRotation[lVar12] =
                   *(int *)((long)&local_a8._M_dataplus._M_p + lVar12 * 4) != 0;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            goto LAB_00412073;
          }
        }
        pcVar2 = this->filePtr;
        iVar5 = strncmp("INHERIT_SCL",pcVar2,0xb);
        if (iVar5 == 0) {
          bVar1 = pcVar2[0xb];
          if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
            pcVar11 = pcVar2 + 0xc;
            if (bVar1 == 0) {
              pcVar11 = pcVar2 + 0xb;
            }
            this->filePtr = pcVar11;
            lVar12 = 0;
            do {
              ParseLV4MeshLong(this,(uint *)((long)&local_a8._M_dataplus._M_p + lVar12));
              lVar12 = lVar12 + 4;
            } while (lVar12 != 0xc);
            lVar12 = 0;
            do {
              (mesh->inherit).abInheritScaling[lVar12] =
                   *(int *)((long)&local_a8._M_dataplus._M_p + lVar12 * 4) != 0;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            goto LAB_00412073;
          }
        }
        goto LAB_00411cfa;
      }
      bVar1 = pcVar2[7];
      if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
      goto LAB_00411c5f;
      pcVar11 = pcVar2 + 8;
      if (bVar1 == 0) {
        pcVar11 = pcVar2 + 7;
      }
      this->filePtr = pcVar11;
      apOut = local_78;
LAB_0041206e:
      ParseLV4MeshFloatTriple(this,&apOut->a1);
LAB_00412073:
      iVar9 = 1;
    }
  } while( true );
}

Assistant:

void Parser::ParseLV2NodeTransformBlock(ASE::BaseNode& mesh)
{
    AI_ASE_PARSER_INIT();
    int mode   = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            // name of the node
            if (TokenMatch(filePtr,"NODE_NAME" ,9))
            {
                std::string temp;
                if(!ParseString(temp,"*NODE_NAME"))
                    SkipToNextToken();

                std::string::size_type s;
                if (temp == mesh.mName)
                {
                    mode = 1;
                }
                else if (std::string::npos != (s = temp.find(".Target")) &&
                    mesh.mName == temp.substr(0,s))
                {
                    // This should be either a target light or a target camera
                    if ( (mesh.mType == BaseNode::Light &&  ((ASE::Light&)mesh) .mLightType  == ASE::Light::TARGET) ||
                         (mesh.mType == BaseNode::Camera && ((ASE::Camera&)mesh).mCameraType == ASE::Camera::TARGET))
                    {
                        mode = 2;
                    }
                    else {
                        ASSIMP_LOG_ERROR("ASE: Ignoring target transform, "
                            "this is no spot light or target camera");
                    }
                }
                else
                {
                    ASSIMP_LOG_ERROR("ASE: Unknown node transformation: " + temp);
                    // mode = 0
                }
                continue;
            }
            if (mode)
            {
                // fourth row of the transformation matrix - and also the
                // only information here that is interesting for targets
                if (TokenMatch(filePtr,"TM_ROW3" ,7))
                {
                    ParseLV4MeshFloatTriple((mode == 1 ? mesh.mTransform[3] : &mesh.mTargetPosition.x));
                    continue;
                }
                if (mode == 1)
                {
                    // first row of the transformation matrix
                    if (TokenMatch(filePtr,"TM_ROW0" ,7))
                    {
                        ParseLV4MeshFloatTriple(mesh.mTransform[0]);
                        continue;
                    }
                    // second row of the transformation matrix
                    if (TokenMatch(filePtr,"TM_ROW1" ,7))
                    {
                        ParseLV4MeshFloatTriple(mesh.mTransform[1]);
                        continue;
                    }
                    // third row of the transformation matrix
                    if (TokenMatch(filePtr,"TM_ROW2" ,7))
                    {
                        ParseLV4MeshFloatTriple(mesh.mTransform[2]);
                        continue;
                    }
                    // inherited position axes
                    if (TokenMatch(filePtr,"INHERIT_POS" ,11))
                    {
                        unsigned int aiVal[3];
                        ParseLV4MeshLongTriple(aiVal);

                        for (unsigned int i = 0; i < 3;++i)
                            mesh.inherit.abInheritPosition[i] = aiVal[i] != 0;
                        continue;
                    }
                    // inherited rotation axes
                    if (TokenMatch(filePtr,"INHERIT_ROT" ,11))
                    {
                        unsigned int aiVal[3];
                        ParseLV4MeshLongTriple(aiVal);

                        for (unsigned int i = 0; i < 3;++i)
                            mesh.inherit.abInheritRotation[i] = aiVal[i] != 0;
                        continue;
                    }
                    // inherited scaling axes
                    if (TokenMatch(filePtr,"INHERIT_SCL" ,11))
                    {
                        unsigned int aiVal[3];
                        ParseLV4MeshLongTriple(aiVal);

                        for (unsigned int i = 0; i < 3;++i)
                            mesh.inherit.abInheritScaling[i] = aiVal[i] != 0;
                        continue;
                    }
                }
            }
        }
        AI_ASE_HANDLE_SECTION("2","*NODE_TM");
    }
    return;
}